

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdef_block_simd.h
# Opt level: O3

void cdef_filter_8_1_avx2
               (void *dest,int dstride,uint16_t *in,int pri_strength,int sec_strength,int dir,
               int pri_damping,int sec_damping,int coeff_shift,int block_width,int block_height)

{
  undefined2 uVar1;
  int iVar2;
  long lVar3;
  uint uVar4;
  ulong uVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  bool bVar10;
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [16];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [16];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar23 [32];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [32];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [16];
  undefined1 auVar46 [32];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar47 [32];
  undefined1 auVar48 [16];
  
  bVar10 = ((uint)pri_strength >> (coeff_shift & 0x1fU) & 1) != 0;
  lVar3 = (long)cdef_directions_padded[(long)dir + 2][0];
  lVar7 = (long)cdef_directions_padded[(long)dir + 2][1];
  auVar23._0_2_ = (undefined2)pri_strength;
  if (block_width == 8) {
    uVar4 = pri_damping;
    if (pri_strength != 0) {
      iVar2 = 0x1f;
      if (pri_strength != 0) {
        for (; (uint)pri_strength >> iVar2 == 0; iVar2 = iVar2 + -1) {
        }
      }
      uVar4 = pri_damping - iVar2;
      if (pri_damping < iVar2) {
        uVar4 = 0;
      }
    }
    if (0 < block_height) {
      auVar23._2_2_ = auVar23._0_2_;
      auVar23._4_2_ = auVar23._0_2_;
      auVar23._6_2_ = auVar23._0_2_;
      auVar23._8_2_ = auVar23._0_2_;
      auVar23._10_2_ = auVar23._0_2_;
      auVar23._12_2_ = auVar23._0_2_;
      auVar23._14_2_ = auVar23._0_2_;
      auVar23._16_2_ = auVar23._0_2_;
      auVar23._18_2_ = auVar23._0_2_;
      auVar23._20_2_ = auVar23._0_2_;
      auVar23._22_2_ = auVar23._0_2_;
      auVar23._24_2_ = auVar23._0_2_;
      auVar23._26_2_ = auVar23._0_2_;
      auVar23._28_2_ = auVar23._0_2_;
      auVar23._30_2_ = auVar23._0_2_;
      uVar1 = (undefined2)cdef_pri_taps[bVar10][0];
      auVar41._2_2_ = uVar1;
      auVar41._0_2_ = uVar1;
      auVar41._4_2_ = uVar1;
      auVar41._6_2_ = uVar1;
      auVar41._8_2_ = uVar1;
      auVar41._10_2_ = uVar1;
      auVar41._12_2_ = uVar1;
      auVar41._14_2_ = uVar1;
      auVar41._16_2_ = uVar1;
      auVar41._18_2_ = uVar1;
      auVar41._20_2_ = uVar1;
      auVar41._22_2_ = uVar1;
      auVar41._24_2_ = uVar1;
      auVar41._26_2_ = uVar1;
      auVar41._28_2_ = uVar1;
      auVar41._30_2_ = uVar1;
      uVar1 = (undefined2)cdef_pri_taps[bVar10][1];
      auVar11._2_2_ = uVar1;
      auVar11._0_2_ = uVar1;
      auVar11._4_2_ = uVar1;
      auVar11._6_2_ = uVar1;
      auVar11._8_2_ = uVar1;
      auVar11._10_2_ = uVar1;
      auVar11._12_2_ = uVar1;
      auVar11._14_2_ = uVar1;
      auVar11._16_2_ = uVar1;
      auVar11._18_2_ = uVar1;
      auVar11._20_2_ = uVar1;
      auVar11._22_2_ = uVar1;
      auVar11._24_2_ = uVar1;
      auVar11._26_2_ = uVar1;
      auVar11._28_2_ = uVar1;
      auVar11._30_2_ = uVar1;
      uVar5 = 0;
      auVar13._8_2_ = 8;
      auVar13._0_8_ = 0x8000800080008;
      auVar13._10_2_ = 8;
      auVar13._12_2_ = 8;
      auVar13._14_2_ = 8;
      auVar13._16_2_ = 8;
      auVar13._18_2_ = 8;
      auVar13._20_2_ = 8;
      auVar13._22_2_ = 8;
      auVar13._24_2_ = 8;
      auVar13._26_2_ = 8;
      auVar13._28_2_ = 8;
      auVar13._30_2_ = 8;
      do {
        auVar15._0_16_ =
             ZEXT116(0) * *(undefined1 (*) [16])in +
             ZEXT116(1) * *(undefined1 (*) [16])((long)in + 0x120);
        auVar15._16_16_ =
             ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * *(undefined1 (*) [16])in;
        auVar14 = vlddqu_avx(*(undefined1 (*) [16])(*(undefined1 (*) [16])in + lVar3 * 2));
        auVar17 = vlddqu_avx(*(undefined1 (*) [16])
                              (*(undefined1 (*) [16])((long)in + 0x120) + lVar3 * 2));
        auVar20._16_16_ = auVar14;
        auVar20._0_16_ = auVar17;
        auVar14 = vlddqu_avx(*(undefined1 (*) [16])((long)in + lVar3 * -2));
        auVar17 = vlddqu_avx(*(undefined1 (*) [16])((long)in + lVar3 * -2 + 0x120));
        auVar29._16_16_ = auVar14;
        auVar29._0_16_ = auVar17;
        auVar12 = vpsubw_avx2(auVar20,auVar15);
        auVar22 = vpabsw_avx2(auVar12);
        auVar31 = vpsrlw_avx2(auVar22,ZEXT416(uVar4));
        auVar21 = vpsraw_avx2(auVar12,0xf);
        auVar31 = vpsubusw_avx2(auVar23,auVar31);
        auVar22 = vpminsw_avx2(auVar22,auVar31);
        auVar31 = vpaddw_avx2(auVar22,auVar21);
        auVar22 = vpsubw_avx2(auVar29,auVar15);
        auVar39 = vpsraw_avx2(auVar22,0xf);
        auVar22 = vpabsw_avx2(auVar22);
        auVar12 = vpsrlw_avx2(auVar22,ZEXT416(uVar4));
        auVar12 = vpsubusw_avx2(auVar23,auVar12);
        auVar22 = vpminsw_avx2(auVar12,auVar22);
        auVar22 = vpaddw_avx2(auVar39,auVar22);
        auVar22 = vpaddw_avx2(auVar39 ^ auVar22,auVar31 ^ auVar21);
        auVar12 = vpmullw_avx2(auVar22,auVar41);
        auVar14 = vlddqu_avx(*(undefined1 (*) [16])(*(undefined1 (*) [16])in + lVar7 * 2));
        auVar17 = vlddqu_avx(*(undefined1 (*) [16])
                              (*(undefined1 (*) [16])((long)in + 0x120) + lVar7 * 2));
        auVar30._16_16_ = auVar14;
        auVar30._0_16_ = auVar17;
        auVar14 = vlddqu_avx(*(undefined1 (*) [16])((long)in + lVar7 * -2));
        auVar17 = vlddqu_avx(*(undefined1 (*) [16])((long)in + lVar7 * -2 + 0x120));
        auVar40._16_16_ = auVar14;
        auVar40._0_16_ = auVar17;
        auVar22 = vpsubw_avx2(auVar30,auVar15);
        auVar39 = vpsraw_avx2(auVar22,0xf);
        auVar22 = vpabsw_avx2(auVar22);
        auVar31 = vpsrlw_avx2(auVar22,ZEXT416(uVar4));
        auVar31 = vpsubusw_avx2(auVar23,auVar31);
        auVar22 = vpminsw_avx2(auVar31,auVar22);
        auVar31 = vpaddw_avx2(auVar39,auVar22);
        auVar22 = vpsubw_avx2(auVar40,auVar15);
        auVar46 = vpsraw_avx2(auVar22,0xf);
        auVar22 = vpabsw_avx2(auVar22);
        auVar21 = vpsrlw_avx2(auVar22,ZEXT416(uVar4));
        auVar21 = vpsubusw_avx2(auVar23,auVar21);
        auVar22 = vpminsw_avx2(auVar22,auVar21);
        auVar22 = vpaddw_avx2(auVar22,auVar46);
        auVar22 = vpaddw_avx2(auVar22 ^ auVar46,auVar39 ^ auVar31);
        auVar22 = vpmullw_avx2(auVar22,auVar11);
        auVar22 = vpaddw_avx2(auVar22,auVar12);
        auVar31 = vpsraw_avx2(auVar22,0xf);
        auVar22 = vpaddw_avx2(auVar22,auVar13);
        auVar22 = vpaddw_avx2(auVar22,auVar31);
        auVar22 = vpsraw_avx2(auVar22,4);
        auVar22 = vpaddw_avx2(auVar22,auVar15);
        auVar22 = vpackuswb_avx2(auVar22,auVar23);
        *(long *)dest = auVar22._16_8_;
        *(long *)((long)dest + (long)dstride) = auVar22._0_8_;
        uVar5 = uVar5 + 2;
        in = (uint16_t *)((long)in + 0x240);
        dest = (void *)((long)dest + (long)dstride * 2);
      } while (uVar5 < (uint)block_height);
    }
  }
  else {
    uVar4 = pri_damping;
    if (pri_strength != 0) {
      iVar2 = 0x1f;
      if (pri_strength != 0) {
        for (; (uint)pri_strength >> iVar2 == 0; iVar2 = iVar2 + -1) {
        }
      }
      uVar4 = pri_damping - iVar2;
      if (pri_damping < iVar2) {
        uVar4 = 0;
      }
    }
    if (0 < block_height) {
      auVar22._2_2_ = auVar23._0_2_;
      auVar22._0_2_ = auVar23._0_2_;
      auVar22._4_2_ = auVar23._0_2_;
      auVar22._6_2_ = auVar23._0_2_;
      auVar22._8_2_ = auVar23._0_2_;
      auVar22._10_2_ = auVar23._0_2_;
      auVar22._12_2_ = auVar23._0_2_;
      auVar22._14_2_ = auVar23._0_2_;
      auVar22._16_2_ = auVar23._0_2_;
      auVar22._18_2_ = auVar23._0_2_;
      auVar22._20_2_ = auVar23._0_2_;
      auVar22._22_2_ = auVar23._0_2_;
      auVar22._24_2_ = auVar23._0_2_;
      auVar22._26_2_ = auVar23._0_2_;
      auVar22._28_2_ = auVar23._0_2_;
      auVar22._30_2_ = auVar23._0_2_;
      uVar1 = (undefined2)cdef_pri_taps[bVar10][0];
      auVar31._2_2_ = uVar1;
      auVar31._0_2_ = uVar1;
      auVar31._4_2_ = uVar1;
      auVar31._6_2_ = uVar1;
      auVar31._8_2_ = uVar1;
      auVar31._10_2_ = uVar1;
      auVar31._12_2_ = uVar1;
      auVar31._14_2_ = uVar1;
      auVar31._16_2_ = uVar1;
      auVar31._18_2_ = uVar1;
      auVar31._20_2_ = uVar1;
      auVar31._22_2_ = uVar1;
      auVar31._24_2_ = uVar1;
      auVar31._26_2_ = uVar1;
      auVar31._28_2_ = uVar1;
      auVar31._30_2_ = uVar1;
      uVar1 = (undefined2)cdef_pri_taps[bVar10][1];
      auVar12._2_2_ = uVar1;
      auVar12._0_2_ = uVar1;
      auVar12._4_2_ = uVar1;
      auVar12._6_2_ = uVar1;
      auVar12._8_2_ = uVar1;
      auVar12._10_2_ = uVar1;
      auVar12._12_2_ = uVar1;
      auVar12._14_2_ = uVar1;
      auVar12._16_2_ = uVar1;
      auVar12._18_2_ = uVar1;
      auVar12._20_2_ = uVar1;
      auVar12._22_2_ = uVar1;
      auVar12._24_2_ = uVar1;
      auVar12._26_2_ = uVar1;
      auVar12._28_2_ = uVar1;
      auVar12._30_2_ = uVar1;
      lVar6 = (long)dstride;
      lVar8 = lVar7 * -2;
      lVar9 = lVar3 * -2;
      uVar5 = 0;
      auVar21._8_2_ = 8;
      auVar21._0_8_ = 0x8000800080008;
      auVar21._10_2_ = 8;
      auVar21._12_2_ = 8;
      auVar21._14_2_ = 8;
      auVar21._16_2_ = 8;
      auVar21._18_2_ = 8;
      auVar21._20_2_ = 8;
      auVar21._22_2_ = 8;
      auVar21._24_2_ = 8;
      auVar21._26_2_ = 8;
      auVar21._28_2_ = 8;
      auVar21._30_2_ = 8;
      do {
        auVar14._8_8_ = 0;
        auVar14._0_8_ = *(ulong *)in;
        auVar17._8_8_ = 0;
        auVar17._0_8_ = *(ulong *)((long)in + 0x120);
        auVar14 = vpunpcklqdq_avx(auVar17,auVar14);
        auVar18._8_8_ = 0;
        auVar18._0_8_ = *(ulong *)((long)in + 0x240);
        auVar24._8_8_ = 0;
        auVar24._0_8_ = *(ulong *)((long)in + 0x360);
        auVar17 = vpunpcklqdq_avx(auVar24,auVar18);
        auVar16._0_16_ = ZEXT116(0) * auVar14 + ZEXT116(1) * auVar17;
        auVar16._16_16_ = ZEXT116(1) * auVar14;
        auVar19._8_8_ = 0;
        auVar19._0_8_ = *(ulong *)((long)in + lVar3 * 2);
        auVar25._8_8_ = 0;
        auVar25._0_8_ = *(ulong *)((long)in + lVar3 * 2 + 0x120);
        auVar14 = vpunpcklqdq_avx(auVar25,auVar19);
        auVar26._8_8_ = 0;
        auVar26._0_8_ = *(ulong *)((long)in + lVar3 * 2 + 0x240);
        auVar33._8_8_ = 0;
        auVar33._0_8_ = *(ulong *)((long)in + lVar3 * 2 + 0x360);
        auVar17 = vpunpcklqdq_avx(auVar33,auVar26);
        auVar39._0_16_ = ZEXT116(0) * auVar14 + ZEXT116(1) * auVar17;
        auVar39._16_16_ = ZEXT116(1) * auVar14;
        auVar23 = vpsubw_avx2(auVar39,auVar16);
        auVar32 = vpsraw_avx2(auVar23,0xf);
        auVar23 = vpabsw_avx2(auVar23);
        auVar39 = vpsrlw_avx2(auVar23,ZEXT416(uVar4));
        auVar39 = vpsubusw_avx2(auVar22,auVar39);
        auVar23 = vpminsw_avx2(auVar39,auVar23);
        auVar39 = vpaddw_avx2(auVar23,auVar32);
        auVar27._8_8_ = 0;
        auVar27._0_8_ = *(ulong *)((long)in + lVar9);
        auVar34._8_8_ = 0;
        auVar34._0_8_ = *(ulong *)((long)in + lVar9 + 0x120);
        auVar14 = vpunpcklqdq_avx(auVar34,auVar27);
        auVar35._8_8_ = 0;
        auVar35._0_8_ = *(ulong *)((long)in + lVar9 + 0x240);
        auVar42._8_8_ = 0;
        auVar42._0_8_ = *(ulong *)((long)in + lVar9 + 0x360);
        auVar17 = vpunpcklqdq_avx(auVar42,auVar35);
        auVar46._0_16_ = ZEXT116(0) * auVar14 + ZEXT116(1) * auVar17;
        auVar46._16_16_ = ZEXT116(1) * auVar14;
        auVar23 = vpsubw_avx2(auVar46,auVar16);
        auVar41 = vpsraw_avx2(auVar23,0xf);
        auVar23 = vpabsw_avx2(auVar23);
        auVar46 = vpsrlw_avx2(auVar23,ZEXT416(uVar4));
        auVar46 = vpsubusw_avx2(auVar22,auVar46);
        auVar23 = vpminsw_avx2(auVar46,auVar23);
        auVar23 = vpaddw_avx2(auVar41,auVar23);
        auVar23 = vpaddw_avx2(auVar41 ^ auVar23,auVar39 ^ auVar32);
        auVar46 = vpmullw_avx2(auVar23,auVar31);
        auVar28._8_8_ = 0;
        auVar28._0_8_ = *(ulong *)((long)in + lVar7 * 2);
        auVar36._8_8_ = 0;
        auVar36._0_8_ = *(ulong *)((long)in + lVar7 * 2 + 0x120);
        auVar14 = vpunpcklqdq_avx(auVar36,auVar28);
        auVar37._8_8_ = 0;
        auVar37._0_8_ = *(ulong *)((long)in + lVar7 * 2 + 0x240);
        auVar43._8_8_ = 0;
        auVar43._0_8_ = *(ulong *)((long)in + lVar7 * 2 + 0x360);
        auVar17 = vpunpcklqdq_avx(auVar43,auVar37);
        auVar32._0_16_ = ZEXT116(0) * auVar14 + ZEXT116(1) * auVar17;
        auVar32._16_16_ = ZEXT116(1) * auVar14;
        auVar23 = vpsubw_avx2(auVar32,auVar16);
        auVar41 = vpsraw_avx2(auVar23,0xf);
        auVar23 = vpabsw_avx2(auVar23);
        auVar39 = vpsrlw_avx2(auVar23,ZEXT416(uVar4));
        auVar39 = vpsubusw_avx2(auVar22,auVar39);
        auVar23 = vpminsw_avx2(auVar39,auVar23);
        auVar39 = vpaddw_avx2(auVar41,auVar23);
        auVar38._8_8_ = 0;
        auVar38._0_8_ = *(ulong *)((long)in + lVar8);
        auVar44._8_8_ = 0;
        auVar44._0_8_ = *(ulong *)((long)in + lVar8 + 0x120);
        auVar14 = vpunpcklqdq_avx(auVar44,auVar38);
        auVar45._8_8_ = 0;
        auVar45._0_8_ = *(ulong *)((long)in + lVar8 + 0x240);
        auVar48._8_8_ = 0;
        auVar48._0_8_ = *(ulong *)((long)in + lVar8 + 0x360);
        auVar17 = vpunpcklqdq_avx(auVar48,auVar45);
        auVar47._0_16_ = ZEXT116(0) * auVar14 + ZEXT116(1) * auVar17;
        auVar47._16_16_ = ZEXT116(1) * auVar14;
        auVar23 = vpsubw_avx2(auVar47,auVar16);
        auVar47 = vpsraw_avx2(auVar23,0xf);
        auVar23 = vpabsw_avx2(auVar23);
        auVar32 = vpsrlw_avx2(auVar23,ZEXT416(uVar4));
        auVar32 = vpsubusw_avx2(auVar22,auVar32);
        auVar23 = vpminsw_avx2(auVar23,auVar32);
        auVar23 = vpaddw_avx2(auVar23,auVar47);
        auVar23 = vpaddw_avx2(auVar23 ^ auVar47,auVar41 ^ auVar39);
        auVar23 = vpmullw_avx2(auVar23,auVar12);
        auVar23 = vpaddw_avx2(auVar23,auVar46);
        auVar39 = vpsraw_avx2(auVar23,0xf);
        auVar23 = vpaddw_avx2(auVar23,auVar21);
        auVar23 = vpaddw_avx2(auVar23,auVar39);
        auVar23 = vpsraw_avx2(auVar23,4);
        auVar23 = vpaddw_avx2(auVar23,auVar16);
        auVar23 = vpackuswb_avx2(auVar23,auVar22);
        *(int *)dest = auVar23._20_4_;
        *(int *)((long)dest + lVar6) = auVar23._16_4_;
        *(int *)((long)dest + lVar6 * 2) = auVar23._4_4_;
        *(int *)((long)dest + lVar6 * 3) = auVar23._0_4_;
        uVar5 = uVar5 + 4;
        in = (uint16_t *)((long)in + 0x480);
        dest = (void *)((long)dest + lVar6 * 4);
      } while (uVar5 < (uint)block_height);
    }
  }
  return;
}

Assistant:

void SIMD_FUNC(cdef_filter_8_1)(void *dest, int dstride, const uint16_t *in,
                                int pri_strength, int sec_strength, int dir,
                                int pri_damping, int sec_damping,
                                int coeff_shift, int block_width,
                                int block_height) {
  if (block_width == 8) {
    filter_block_8x8(/*is_lowbd=*/1, dest, dstride, in, pri_strength,
                     sec_strength, dir, pri_damping, sec_damping, coeff_shift,
                     block_height, /*enable_primary=*/1,
                     /*enable_secondary=*/0);
  } else {
    filter_block_4x4(/*is_lowbd=*/1, dest, dstride, in, pri_strength,
                     sec_strength, dir, pri_damping, sec_damping, coeff_shift,
                     block_height, /*enable_primary=*/1,
                     /*enable_secondary=*/0);
  }
}